

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_font * rf_load_image_font(rf_font *__return_storage_ptr__,rf_image image,rf_color key,
                            rf_allocator allocator)

{
  rf_font local_220;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined8 local_1c0;
  rf_glyph_info *local_1b8;
  rf_glyph_info *glyphs;
  int local_1a8;
  int codepoints_count;
  int codepoints [95];
  void *local_20;
  rf_allocator allocator_local;
  rf_color key_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  local_20 = allocator.user_data;
  allocator_local.allocator_proc._4_4_ = key;
  memset(__return_storage_ptr__,0,0x38);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    memcpy(&local_1a8,&DAT_001b13e0,0x17c);
    glyphs._4_4_ = 0x60;
    local_1d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_1c8 = "rf_load_image_font";
    local_1c0 = 0x5cc8;
    local_1e8 = 0;
    local_1e0 = 0xc00;
    local_1d8 = 0;
    local_1b8 = (rf_glyph_info *)(*(code *)allocator_local.user_data)(&local_20,1);
    rf_compute_glyph_metrics_from_image
              (image,allocator_local.allocator_proc._4_4_,&local_1a8,local_1b8,0x60);
    rf_load_image_font_from_data(&local_220,image,local_1b8,0x60);
    memcpy(__return_storage_ptr__,&local_220,0x38);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_load_image_font(rf_image image, rf_color key, rf_allocator allocator)
{
    rf_font result = {0};

    if (image.valid)
    {
        const int codepoints[]     = RF_BUILTIN_FONT_CHARS;
        const int codepoints_count = RF_BUILTIN_CODEPOINTS_COUNT;

        rf_glyph_info* glyphs = RF_ALLOC(allocator, codepoints_count * sizeof(rf_glyph_info));

        rf_compute_glyph_metrics_from_image(image, key, codepoints, glyphs, codepoints_count);

        result = rf_load_image_font_from_data(image, glyphs, codepoints_count);
    }

    return result;
}